

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

bool __thiscall dtc::input_buffer::consume_hex_byte(input_buffer *this,uint8_t *outByte)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint8_t *outByte_local;
  input_buffer *this_local;
  
  cVar1 = operator[](this,0);
  bVar2 = ishexdigit(cVar1);
  if (!bVar2) {
    cVar1 = operator[](this,1);
    bVar2 = ishexdigit(cVar1);
    if (!bVar2) {
      return false;
    }
  }
  cVar1 = operator[](this,0);
  iVar3 = anon_unknown.dwarf_82912::digittoint((int)cVar1);
  cVar1 = operator[](this,1);
  iVar4 = anon_unknown.dwarf_82912::digittoint((int)cVar1);
  *outByte = (byte)(iVar3 << 4) | (byte)iVar4;
  this->cursor = this->cursor + 2;
  return true;
}

Assistant:

bool
input_buffer::consume_hex_byte(uint8_t &outByte)
{
	if (!ishexdigit((*this)[0]) && !ishexdigit((*this)[1]))
	{
		return false;
	}
	outByte = (digittoint((*this)[0]) << 4) | digittoint((*this)[1]);
	cursor += 2;
	return true;
}